

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Parser
XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *pool;
  XML_Bool XVar1;
  XML_Char XVar2;
  undefined4 uVar3;
  DTD *pDVar4;
  ELEMENT_TYPE *pEVar5;
  XML_Parser pXVar6;
  XML_Parser pXVar7;
  unsigned_long uVar8;
  DTD *table_01;
  KEY pXVar9;
  XML_StartElementHandler p_Var10;
  XML_EndElementHandler p_Var11;
  XML_CharacterDataHandler p_Var12;
  XML_ProcessingInstructionHandler p_Var13;
  XML_CommentHandler p_Var14;
  XML_StartCdataSectionHandler p_Var15;
  XML_EndCdataSectionHandler p_Var16;
  XML_DefaultHandler p_Var17;
  XML_UnparsedEntityDeclHandler p_Var18;
  XML_NotationDeclHandler p_Var19;
  XML_StartNamespaceDeclHandler p_Var20;
  XML_EndNamespaceDeclHandler p_Var21;
  XML_NotStandaloneHandler p_Var22;
  XML_ExternalEntityRefHandler p_Var23;
  XML_SkippedEntityHandler p_Var24;
  XML_UnknownEncodingHandler p_Var25;
  XML_ElementDeclHandler p_Var26;
  XML_AttlistDeclHandler p_Var27;
  XML_EntityDeclHandler p_Var28;
  XML_XmlDeclHandler p_Var29;
  uint uVar30;
  XML_Bool XVar31;
  XML_Parser parser;
  NAMED *pNVar32;
  XML_Char *pXVar33;
  NAMED *pNVar34;
  PREFIX *pPVar35;
  KEY pXVar36;
  NAMED *pNVar37;
  XML_Char *pXVar38;
  DTD *in_RCX;
  XML_Parser pXVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  KEY local_128;
  XML_Char *local_120;
  HASH_TABLE_ITER local_d8;
  XML_Char tmp [2];
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  pDVar4 = oldParser->m_dtd;
  p_Var10 = oldParser->m_startElementHandler;
  p_Var11 = oldParser->m_endElementHandler;
  p_Var12 = oldParser->m_characterDataHandler;
  p_Var13 = oldParser->m_processingInstructionHandler;
  p_Var14 = oldParser->m_commentHandler;
  p_Var15 = oldParser->m_startCdataSectionHandler;
  p_Var16 = oldParser->m_endCdataSectionHandler;
  p_Var17 = oldParser->m_defaultHandler;
  p_Var18 = oldParser->m_unparsedEntityDeclHandler;
  p_Var19 = oldParser->m_notationDeclHandler;
  p_Var20 = oldParser->m_startNamespaceDeclHandler;
  p_Var21 = oldParser->m_endNamespaceDeclHandler;
  p_Var22 = oldParser->m_notStandaloneHandler;
  p_Var23 = oldParser->m_externalEntityRefHandler;
  p_Var24 = oldParser->m_skippedEntityHandler;
  p_Var25 = oldParser->m_unknownEncodingHandler;
  p_Var26 = oldParser->m_elementDeclHandler;
  p_Var27 = oldParser->m_attlistDeclHandler;
  p_Var28 = oldParser->m_entityDeclHandler;
  p_Var29 = oldParser->m_xmlDeclHandler;
  pEVar5 = oldParser->m_declElementType;
  pXVar39 = (XML_Parser)oldParser->m_userData;
  pXVar6 = (XML_Parser)oldParser->m_handlerArg;
  XVar31 = oldParser->m_defaultExpandInternalEntities;
  pXVar7 = oldParser->m_externalEntityRefHandlerArg;
  XVar1 = oldParser->m_ns_triplets;
  uVar8 = oldParser->m_hash_secret_salt;
  if (oldParser->m_ns == '\0') {
    pXVar33 = (XML_Char *)0x0;
  }
  else {
    in_RCX = (DTD *)CONCAT71((int7)((ulong)in_RCX >> 8),oldParser->m_namespaceSeparator);
    pXVar33 = tmp;
    _tmp = (NAMED **)CONCAT71(stack0xffffffffffffff39,oldParser->m_namespaceSeparator);
  }
  parser = parserCreate(encodingName,&oldParser->m_mem,pXVar33,in_RCX);
  if (parser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  parser->m_startElementHandler = p_Var10;
  parser->m_endElementHandler = p_Var11;
  parser->m_characterDataHandler = p_Var12;
  parser->m_processingInstructionHandler = p_Var13;
  parser->m_commentHandler = p_Var14;
  parser->m_startCdataSectionHandler = p_Var15;
  parser->m_endCdataSectionHandler = p_Var16;
  parser->m_defaultHandler = p_Var17;
  parser->m_unparsedEntityDeclHandler = p_Var18;
  parser->m_notationDeclHandler = p_Var19;
  parser->m_startNamespaceDeclHandler = p_Var20;
  parser->m_endNamespaceDeclHandler = p_Var21;
  parser->m_notStandaloneHandler = p_Var22;
  parser->m_externalEntityRefHandler = p_Var23;
  parser->m_skippedEntityHandler = p_Var24;
  parser->m_unknownEncodingHandler = p_Var25;
  parser->m_elementDeclHandler = p_Var26;
  parser->m_attlistDeclHandler = p_Var27;
  parser->m_entityDeclHandler = p_Var28;
  parser->m_xmlDeclHandler = p_Var29;
  parser->m_declElementType = pEVar5;
  parser->m_userData = pXVar39;
  if (pXVar39 != pXVar6) {
    pXVar39 = parser;
  }
  parser->m_handlerArg = pXVar39;
  if (pXVar7 != oldParser) {
    parser->m_externalEntityRefHandlerArg = pXVar7;
  }
  parser->m_defaultExpandInternalEntities = XVar31;
  parser->m_ns_triplets = XVar1;
  parser->m_hash_secret_salt = uVar8;
  parser->m_parentParser = oldParser;
  table_01 = parser->m_dtd;
  local_d8.p = (pDVar4->prefixes).v;
  local_d8.end = local_d8.p + (pDVar4->prefixes).size;
  pool = &table_01->pool;
  table = &table_01->prefixes;
  do {
    pNVar32 = hashTableIterNext(&local_d8);
    if (pNVar32 == (NAMED *)0x0) {
      local_d8.p = (pDVar4->attributeIds).v;
      local_d8.end = local_d8.p + (pDVar4->attributeIds).size;
      table_00 = &table_01->attributeIds;
      goto LAB_00340b11;
    }
    pXVar33 = poolCopyString(pool,pNVar32->name);
  } while ((pXVar33 != (XML_Char *)0x0) &&
          (pNVar32 = lookup(oldParser,table,pXVar33,0x10), pNVar32 != (NAMED *)0x0));
  goto LAB_00340ab4;
LAB_00340b11:
  pNVar32 = hashTableIterNext(&local_d8);
  if (pNVar32 != (NAMED *)0x0) {
    pXVar33 = (table_01->pool).ptr;
    if (pXVar33 == (table_01->pool).end) {
      XVar31 = poolGrow(pool);
      if (XVar31 == '\0') goto LAB_00340ab4;
      pXVar33 = (table_01->pool).ptr;
    }
    (table_01->pool).ptr = pXVar33 + 1;
    *pXVar33 = '\0';
    pXVar33 = poolCopyString(pool,pNVar32->name);
    if ((pXVar33 == (XML_Char *)0x0) ||
       (pNVar34 = lookup(oldParser,table_00,pXVar33 + 1,0x18), pNVar34 == (NAMED *)0x0))
    goto LAB_00340ab4;
    *(undefined1 *)&pNVar34[2].name = *(undefined1 *)&pNVar32[2].name;
    pXVar36 = pNVar32[1].name;
    if (pXVar36 != (KEY)0x0) {
      *(undefined1 *)((long)&pNVar34[2].name + 1) = *(undefined1 *)((long)&pNVar32[2].name + 1);
      pPVar35 = &table_01->defaultPrefix;
      if ((PREFIX *)pXVar36 != &pDVar4->defaultPrefix) {
        pPVar35 = (PREFIX *)lookup(oldParser,table,*(KEY *)pXVar36,0);
      }
      pNVar34[1].name = (KEY)pPVar35;
    }
    goto LAB_00340b11;
  }
  local_d8.p = (pDVar4->elementTypes).v;
  local_d8.end = local_d8.p + (pDVar4->elementTypes).size;
  while (pNVar32 = hashTableIterNext(&local_d8), pNVar32 != (NAMED *)0x0) {
    pXVar33 = poolCopyString(pool,pNVar32->name);
    if ((pXVar33 == (XML_Char *)0x0) ||
       (pNVar34 = lookup(oldParser,&table_01->elementTypes,pXVar33,0x28), pNVar34 == (NAMED *)0x0))
    goto LAB_00340ab4;
    if ((long)*(int *)&pNVar32[3].name != 0) {
      pXVar36 = (KEY)(*(parser->m_mem).malloc_fcn)((long)*(int *)&pNVar32[3].name * 0x18);
      pNVar34[4].name = pXVar36;
      if (pXVar36 == (KEY)0x0) goto LAB_00340ab4;
    }
    if (pNVar32[2].name != (KEY)0x0) {
      pNVar37 = lookup(oldParser,table_00,*(KEY *)pNVar32[2].name,0);
      pNVar34[2].name = (KEY)pNVar37;
    }
    uVar3 = *(undefined4 *)&pNVar32[3].name;
    *(undefined4 *)&pNVar34[3].name = uVar3;
    *(undefined4 *)((long)&pNVar34[3].name + 4) = uVar3;
    if (pNVar32[1].name != (KEY)0x0) {
      pNVar37 = lookup(oldParser,table,*(KEY *)pNVar32[1].name,0);
      pNVar34[1].name = (KEY)pNVar37;
    }
    lVar42 = 0;
    for (lVar40 = 0; lVar40 < *(int *)&pNVar34[3].name; lVar40 = lVar40 + 1) {
      pNVar37 = lookup(oldParser,table_00,(KEY)**(undefined8 **)(pNVar32[4].name + lVar42),0);
      pXVar36 = pNVar34[4].name;
      *(NAMED **)(pXVar36 + lVar42) = pNVar37;
      pXVar9 = pNVar32[4].name;
      pXVar36[lVar42 + 8] = pXVar9[lVar42 + 8];
      pXVar33 = *(XML_Char **)(pXVar9 + lVar42 + 0x10);
      if (pXVar33 == (XML_Char *)0x0) {
        pXVar36 = pXVar36 + lVar42 + 0x10;
        pXVar36[0] = '\0';
        pXVar36[1] = '\0';
        pXVar36[2] = '\0';
        pXVar36[3] = '\0';
        pXVar36[4] = '\0';
        pXVar36[5] = '\0';
        pXVar36[6] = '\0';
        pXVar36[7] = '\0';
      }
      else {
        pXVar33 = poolCopyString(pool,pXVar33);
        *(XML_Char **)(pNVar34[4].name + lVar42 + 0x10) = pXVar33;
        if (pXVar33 == (XML_Char *)0x0) goto LAB_00340ab4;
      }
      lVar42 = lVar42 + 0x18;
    }
  }
  _tmp = (pDVar4->generalEntities).v;
  local_128 = (KEY)0x0;
  local_120 = (XML_Char *)0x0;
  while (pNVar32 = hashTableIterNext((HASH_TABLE_ITER *)tmp), pNVar32 != (NAMED *)0x0) {
    pXVar33 = poolCopyString(pool,pNVar32->name);
    if ((pXVar33 == (XML_Char *)0x0) ||
       (pNVar34 = lookup(oldParser,&table_01->generalEntities,pXVar33,0x40), pNVar34 == (NAMED *)0x0
       )) goto LAB_00340ab4;
    if (pNVar32[3].name == (XML_Char *)0x0) {
      pXVar33 = pNVar32[1].name;
      iVar41 = *(int *)&pNVar32[2].name;
      if (((table_01->pool).ptr == (XML_Char *)0x0) && (XVar31 = poolGrow(pool), XVar31 == '\0'))
      goto LAB_00340ab4;
      for (; 0 < iVar41; iVar41 = iVar41 + -1) {
        pXVar38 = (table_01->pool).ptr;
        if (pXVar38 == (table_01->pool).end) {
          XVar31 = poolGrow(pool);
          if (XVar31 == '\0') goto LAB_00340ab4;
          pXVar38 = (table_01->pool).ptr;
        }
        XVar2 = *pXVar33;
        (table_01->pool).ptr = pXVar38 + 1;
        *pXVar38 = XVar2;
        pXVar33 = pXVar33 + 1;
      }
      pXVar33 = (table_01->pool).start;
      (table_01->pool).start = (table_01->pool).ptr;
      if (pXVar33 == (XML_Char *)0x0) goto LAB_00340ab4;
      pNVar34[1].name = pXVar33;
      *(undefined4 *)&pNVar34[2].name = *(undefined4 *)&pNVar32[2].name;
    }
    else {
      pXVar33 = poolCopyString(pool,pNVar32[3].name);
      if (pXVar33 == (XML_Char *)0x0) goto LAB_00340ab4;
      pNVar34[3].name = pXVar33;
      pXVar33 = pNVar32[4].name;
      if (pXVar33 != (XML_Char *)0x0) {
        if ((pXVar33 != local_120) &&
           (local_128 = poolCopyString(pool,pXVar33), local_120 = pXVar33,
           local_128 == (XML_Char *)0x0)) goto LAB_00340ab4;
        pNVar34[4].name = local_128;
      }
      if (pNVar32[5].name != (XML_Char *)0x0) {
        pXVar33 = poolCopyString(pool,pNVar32[5].name);
        if (pXVar33 == (XML_Char *)0x0) goto LAB_00340ab4;
        pNVar34[5].name = pXVar33;
      }
    }
    if (pNVar32[6].name != (XML_Char *)0x0) {
      pXVar33 = poolCopyString(pool,pNVar32[6].name);
      if (pXVar33 == (XML_Char *)0x0) goto LAB_00340ab4;
      pNVar34[6].name = pXVar33;
    }
    *(undefined1 *)((long)&pNVar34[7].name + 1) = *(undefined1 *)((long)&pNVar32[7].name + 1);
    *(undefined1 *)((long)&pNVar34[7].name + 2) = *(undefined1 *)((long)&pNVar32[7].name + 2);
  }
  table_01->keepProcessing = pDVar4->keepProcessing;
  table_01->hasParamEntityRefs = pDVar4->hasParamEntityRefs;
  table_01->standalone = pDVar4->standalone;
  table_01->in_eldecl = pDVar4->in_eldecl;
  table_01->scaffold = pDVar4->scaffold;
  uVar30 = pDVar4->scaffSize;
  table_01->contentStringLen = pDVar4->contentStringLen;
  table_01->scaffSize = uVar30;
  table_01->scaffLevel = pDVar4->scaffLevel;
  table_01->scaffIndex = pDVar4->scaffIndex;
  XVar31 = setContext(parser,context);
  if (XVar31 != '\0') {
    parser->m_processor = externalEntityInitProcessor;
    return parser;
  }
LAB_00340ab4:
  XML_ParserFree(parser);
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser,
                               const XML_Char *context,
                               const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;

#ifdef XML_DTD
  if (!context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2];
    *tmp = parser->m_namespaceSeparator;
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  }
  else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (!parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
      || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    /* The DTD instance referenced by parser->m_dtd is shared between the document's
       root parser and external PE parsers, therefore one does not need to
       call setContext. In addition, one also *must* not call setContext,
       because this would overwrite existing prefix->binding pointers in
       parser->m_dtd with ones that get destroyed with the external PE parser.
       This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}